

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*>
 __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
::handle_value<long&>
          (json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
           *this,long *v,bool skip_callback)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar4;
  reference rVar5;
  pair<bool,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*>
  pVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  value;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  
  if ((*(long *)(this + 0x20) == *(long *)(this + 0x30)) && (*(int *)(this + 0x38) == 0)) {
    __assert_fail("!keep_stack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/json.hpp",
                  0x1941,
                  "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = long &]"
                 );
  }
  rVar5 = std::vector<bool,_std::allocator<bool>_>::back
                    ((vector<bool,_std::allocator<bool>_> *)(this + 0x20));
  if ((*rVar5._M_p & rVar5._M_mask) == 0) {
    uVar3 = 0;
    pbVar4 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
    goto LAB_0013c234;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<long_&,_long,_0>(&value,v);
  if (skip_callback) {
LAB_0013c138:
    if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_30,&value);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(*(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    **)this,&local_30);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_30);
      pbVar4 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 **)this;
    }
    else {
      pcVar1 = *(char **)(*(long *)(this + 0x10) + -8);
      if (pcVar1 == (char *)0x0) goto LAB_0013c225;
      if (*pcVar1 == '\x01') {
        if ((*(long *)(this + 0x48) == *(long *)(this + 0x58)) && (*(int *)(this + 0x60) == 0)) {
          __assert_fail("!key_keep_stack.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/json.hpp"
                        ,0x1970,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = long &]"
                       );
        }
        rVar5 = std::vector<bool,_std::allocator<bool>_>::back
                          ((vector<bool,_std::allocator<bool>_> *)(this + 0x48));
        uVar3 = *rVar5._M_p;
        std::_Bit_iterator_base::_M_bump_down((_Bit_iterator_base *)(this + 0x58));
        if ((uVar3 & rVar5._M_mask) == 0) goto LAB_0013c225;
        if (*(long *)(this + 0x70) == 0) {
          __assert_fail("object_element",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/json.hpp"
                        ,0x1979,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = long &]"
                       );
        }
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&local_40,&value);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(*(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      **)(this + 0x70),&local_40);
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_40);
        pbVar4 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   **)(this + 0x70);
      }
      else {
        if (*pcVar1 != '\x02') {
          __assert_fail("ref_stack.back()->is_array() || ref_stack.back()->is_object()",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/json.hpp"
                        ,0x1964,
                        "std::pair<bool, BasicJsonType *> nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>::handle_value(Value &&, const bool) [BasicJsonType = nlohmann::basic_json<>, Value = long &]"
                       );
        }
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                     **)(pcVar1 + 8),&value);
        pbVar4 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)(*(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + -8) + 8) + 8) + -0x10);
      }
    }
    uVar3 = CONCAT71((int7)((ulong)this >> 8),1);
  }
  else {
    bVar2 = std::
            function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
            ::operator()((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                          *)(this + 0x80),
                         (int)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 3),value,
                         &value);
    if (bVar2) goto LAB_0013c138;
LAB_0013c225:
    uVar3 = 0;
    pbVar4 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
  }
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&value);
LAB_0013c234:
  pVar6._0_8_ = uVar3 & 0xffffffff;
  pVar6.second = pbVar4;
  return pVar6;
}

Assistant:

std::pair<bool, BasicJsonType*> handle_value(Value&& v, const bool skip_callback = false)
    {
        JSON_ASSERT(!keep_stack.empty());

        // do not handle this value if we know it would be added to a discarded
        // container
        if (!keep_stack.back())
        {
            return {false, nullptr};
        }

        // create value
        auto value = BasicJsonType(std::forward<Value>(v));

        // check callback
        const bool keep = skip_callback || callback(static_cast<int>(ref_stack.size()), parse_event_t::value, value);

        // do not handle this value if we just learnt it shall be discarded
        if (!keep)
        {
            return {false, nullptr};
        }

        if (ref_stack.empty())
        {
            root = std::move(value);
            return {true, &root};
        }

        // skip this value if we already decided to skip the parent
        // (https://github.com/nlohmann/json/issues/971#issuecomment-413678360)
        if (!ref_stack.back())
        {
            return {false, nullptr};
        }

        // we now only expect arrays and objects
        JSON_ASSERT(ref_stack.back()->is_array() || ref_stack.back()->is_object());

        // array
        if (ref_stack.back()->is_array())
        {
            ref_stack.back()->m_value.array->emplace_back(std::move(value));
            return {true, &(ref_stack.back()->m_value.array->back())};
        }

        // object
        JSON_ASSERT(ref_stack.back()->is_object());
        // check if we should store an element for the current key
        JSON_ASSERT(!key_keep_stack.empty());
        const bool store_element = key_keep_stack.back();
        key_keep_stack.pop_back();

        if (!store_element)
        {
            return {false, nullptr};
        }

        JSON_ASSERT(object_element);
        *object_element = std::move(value);
        return {true, object_element};
    }